

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_connection_free(PacketProtocolLayer *ppl)

{
  ssh1_channel *c_00;
  X11FakeAuth *auth_00;
  ssh_rportfwd *rpf_00;
  ssh_rportfwd *rpf;
  ssh1_channel *c;
  X11FakeAuth *auth;
  ssh1_connection_state *s;
  PacketProtocolLayer *ppl_local;
  
  conf_free((Conf *)ppl[-3].interactor);
  while (c_00 = (ssh1_channel *)delpos234(*(tree234 **)&ppl[-3].remote_bugs,0),
        c_00 != (ssh1_channel *)0x0) {
    ssh1_channel_free(c_00);
  }
  freetree234(*(tree234 **)&ppl[-3].remote_bugs);
  if (ppl[-2].in_pq != (PktInQueue *)0x0) {
    chan_free((Channel *)ppl[-2].in_pq);
  }
  if (ppl[-2].seat != (Seat *)0x0) {
    x11_free_display((X11Display *)ppl[-2].seat);
  }
  while (auth_00 = (X11FakeAuth *)delpos234((tree234 *)ppl[-2].ssh,0), auth_00 != (X11FakeAuth *)0x0
        ) {
    x11_free_fake_auth(auth_00);
  }
  freetree234((tree234 *)ppl[-2].ssh);
  while (rpf_00 = (ssh_rportfwd *)delpos234(*(tree234 **)&ppl[-2].remote_bugs,0),
        rpf_00 != (ssh_rportfwd *)0x0) {
    free_rportfwd(rpf_00);
  }
  freetree234(*(tree234 **)&ppl[-2].remote_bugs);
  portfwdmgr_free((PortFwdManager *)ppl[-1].vt);
  if (ppl[-1].ic_process_queue.ctx != (void *)0x0) {
    free_prompts((prompts_t *)ppl[-1].ic_process_queue.ctx);
  }
  delete_callbacks_for_context(&ppl[-3].seat);
  safefree(&ppl[-3].seat);
  return;
}

Assistant:

static void ssh1_connection_free(PacketProtocolLayer *ppl)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);
    struct X11FakeAuth *auth;
    struct ssh1_channel *c;
    struct ssh_rportfwd *rpf;

    conf_free(s->conf);

    while ((c = delpos234(s->channels, 0)) != NULL)
        ssh1_channel_free(c);
    freetree234(s->channels);
    if (s->mainchan_chan)
        chan_free(s->mainchan_chan);

    if (s->x11disp)
        x11_free_display(s->x11disp);
    while ((auth = delpos234(s->x11authtree, 0)) != NULL)
        x11_free_fake_auth(auth);
    freetree234(s->x11authtree);

    while ((rpf = delpos234(s->rportfwds, 0)) != NULL)
        free_rportfwd(rpf);
    freetree234(s->rportfwds);
    portfwdmgr_free(s->portfwdmgr);

    if (s->antispoof_prompt)
        free_prompts(s->antispoof_prompt);

    delete_callbacks_for_context(s);

    sfree(s);
}